

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O2

Rect __thiscall lunasvg::Rect::intersected(Rect *this,Rect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar4;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Rect RVar12;
  
  uVar1 = rect->w;
  uVar5 = rect->h;
  if (((float)uVar1 < 0.0) || ((float)uVar5 < 0.0)) {
    return *this;
  }
  uVar2 = this->w;
  uVar6 = this->h;
  if ((0.0 <= (float)uVar2) && (0.0 <= (float)uVar6)) {
    uVar3 = this->x;
    uVar7 = this->y;
    auVar9._4_4_ = uVar7;
    auVar9._0_4_ = uVar3;
    uVar4._0_4_ = rect->x;
    uVar4._4_4_ = rect->y;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar4;
    auVar10._0_4_ = (float)uVar1 + (float)(undefined4)uVar4;
    auVar10._4_4_ = (float)uVar5 + (float)uVar4._4_4_;
    auVar10._8_8_ = 0;
    auVar9._8_8_ = 0;
    auVar9 = maxps(auVar8,auVar9);
    auVar11._4_4_ = (float)uVar6 + (float)uVar7;
    auVar11._0_4_ = (float)uVar2 + (float)uVar3;
    auVar11._8_8_ = 0;
    auVar11 = minps(auVar10,auVar11);
    if (auVar9._0_4_ < auVar11._0_4_) {
      if (auVar9._4_4_ < auVar11._4_4_) {
        RVar12.w = auVar11._0_4_ - auVar9._0_4_;
        RVar12.h = auVar11._4_4_ - auVar9._4_4_;
        RVar12._0_8_ = auVar9._0_8_;
        return RVar12;
      }
    }
    return (Rect)ZEXT816(0);
  }
  return *rect;
}

Assistant:

constexpr bool isValid() const { return w >= 0.f && h >= 0.f; }